

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool findKeyPresses<stSampleMulti<short,4>>
               (TWaveformViewT<TSampleMI16> *waveform,TKeyPressCollectionT<TSampleMI16> *res,
               TWaveformT<TSampleMI16> *waveformThreshold,TWaveformT<TSampleMI16> *waveformMax,
               double thresholdBackground,int historySize,int historySizeReset,bool removeLowPower)

{
  pointer *ppsVar1;
  short sVar2;
  stSampleMulti<short,_4> *psVar3;
  size_type __n;
  iterator iVar4;
  pointer psVar5;
  pointer psVar6;
  TKeyPressPosition TVar7;
  TValueCC TVar8;
  int64_t iVar9;
  TKey TVar10;
  TKey TVar11;
  undefined4 uVar12;
  size_type sVar13;
  long lVar14;
  _Elt_pointer plVar15;
  pointer psVar16;
  TKeyPressCollectionT<TSampleMI16> *__range3;
  iterator __end3;
  pointer psVar17;
  short sVar18;
  ulong uVar19;
  long lVar20;
  stKeyPressData<stSampleMulti<short,_4>_> *kp_1;
  size_type __n_00;
  pointer psVar21;
  long lVar22;
  int iVar23;
  stKeyPressData<stSampleMulti<short,_4>_> *psVar24;
  pointer psVar25;
  int iVar26;
  double dVar27;
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  TKeyPressCollectionT<TSampleMI16> res2;
  TWaveformT<TSampleMI16> waveformAbs;
  vector<double,_std::allocator<double>_> rbSamples;
  long local_138;
  double local_130;
  stKeyPressData<stSampleMulti<short,_4>_> local_128;
  vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> local_f0;
  _Deque_base<long,_std::allocator<long>_> local_d8;
  vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> *local_88;
  int local_7c;
  TWaveformT<TSampleMI16> *local_78;
  double local_70;
  long local_68;
  vector<double,_std::allocator<double>_> local_60;
  TWaveformViewT<TSampleMI16> *local_48;
  long local_40;
  long local_38;
  undefined1 auVar28 [16];
  
  psVar25 = (res->
            super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
            ).
            super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((res->
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ).
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar25) {
    (res->
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ).
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar25;
  }
  local_88 = waveformMax;
  local_78 = waveformThreshold;
  local_70 = thresholdBackground;
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::resize
            (waveformThreshold,waveform->n);
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::resize
            (local_88,waveform->n);
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)(historySize * 8),(value_type_conflict5 *)&local_d8,
             (allocator_type *)&local_128);
  __n_00 = (size_type)historySize;
  std::deque<long,_std::allocator<long>_>::deque
            ((deque<long,_std::allocator<long>_> *)&local_d8,__n_00,(allocator_type *)&local_128);
  psVar3 = waveform->samples;
  __n = waveform->n;
  local_48 = waveform;
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::vector
            (&local_f0,__n,(allocator_type *)&local_128);
  if (0 < (long)__n) {
    sVar13 = 0;
    do {
      sVar2 = psVar3[sVar13].super_array<short,_4UL>._M_elems[0];
      sVar18 = -sVar2;
      if (0 < sVar2) {
        sVar18 = sVar2;
      }
      local_f0.
      super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>._M_impl
      .super__Vector_impl_data._M_start[sVar13].super_array<short,_4UL>._M_elems[0] = sVar18;
      sVar13 = sVar13 + 1;
    } while (__n != sVar13);
  }
  local_138 = 0;
  local_7c = historySizeReset;
  if (0 < (long)__n) {
    local_68 = (long)(historySize / 2);
    local_38 = (long)(historySize * 2);
    local_40 = __n - local_38;
    local_130 = 0.0;
    iVar23 = 0;
    do {
      if (local_68 <= local_138) {
        lVar14 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        auVar28._8_4_ =
             (int)((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x23);
        auVar28._0_8_ = lVar14;
        auVar28._12_4_ = 0x45300000;
        iVar26 = (int)lVar14;
        dVar30 = (auVar28._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,iVar26) - 4503599627370496.0);
        dVar31 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar23];
        dVar27 = (double)(int)local_f0.
                              super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_138].
                              super_array<short,_4UL>._M_elems[0];
        local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[iVar23] = dVar27;
        local_130 = ((local_130 * dVar30 - dVar31) + dVar27) / dVar30;
        iVar23 = iVar23 + 1;
        if (iVar26 <= iVar23) {
          iVar23 = 0;
        }
      }
      if (local_138 < (long)__n_00) {
        while (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          plVar15 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            plVar15 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          lVar14 = 0;
          do {
            sVar2 = *(short *)((long)local_f0.
                                     super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[local_138].
                                     super_array<short,_4UL>._M_elems + lVar14);
            sVar18 = *(short *)((long)local_f0.
                                      super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[plVar15[-1]].
                                      super_array<short,_4UL>._M_elems + lVar14);
            if (sVar18 != sVar2) {
              if (sVar2 < sVar18) goto LAB_001224f9;
              break;
            }
            lVar14 = lVar14 + 2;
          } while (lVar14 != 8);
          if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_d8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        }
LAB_001224f9:
        if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                    ((deque<long,std::allocator<long>> *)&local_d8,&local_138);
        }
        else {
          *local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_138;
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      else {
        while ((local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                local_d8._M_impl.super__Deque_impl_data._M_start._M_cur &&
               (*local_d8._M_impl.super__Deque_impl_data._M_start._M_cur <=
                (long)(local_138 - __n_00)))) {
          if (local_d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_d8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_d8._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
            local_d8._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_d8._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
        }
        while (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          plVar15 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            plVar15 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          lVar14 = 0;
          do {
            sVar2 = *(short *)((long)local_f0.
                                     super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[local_138].
                                     super_array<short,_4UL>._M_elems + lVar14);
            sVar18 = *(short *)((long)local_f0.
                                      super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[plVar15[-1]].
                                      super_array<short,_4UL>._M_elems + lVar14);
            if (sVar18 != sVar2) {
              if (sVar2 < sVar18) goto LAB_001225e4;
              break;
            }
            lVar14 = lVar14 + 2;
          } while (lVar14 != 8);
          if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_d8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        }
LAB_001225e4:
        if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                    ((deque<long,std::allocator<long>> *)&local_d8,&local_138);
        }
        else {
          *local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_138;
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        lVar14 = local_138 - local_68;
        if (((lVar14 < local_40 && local_38 <= lVar14) &&
            (*local_d8._M_impl.super__Deque_impl_data._M_start._M_cur == lVar14)) &&
           (local_130 * local_70 <
            (double)(int)local_f0.
                         super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar14].super_array<short,_4UL>.
                         _M_elems[0])) {
          local_128.waveform.samples = local_48->samples;
          iVar9 = local_48->n;
          local_128.waveform.n._0_4_ = (undefined4)iVar9;
          local_128.waveform.n._4_4_ = (undefined4)((ulong)iVar9 >> 0x20);
          local_128.ccAvg._0_4_ = 0;
          local_128.ccAvg._4_4_ = 0;
          local_128.cid = -1;
          local_128.bind = -1;
          local_128.predicted = 0x3f;
          iVar4._M_current =
               (res->
               super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
               ).
               super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_128.pos = lVar14;
          if (iVar4._M_current ==
              (res->
              super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ).
              super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
            ::_M_realloc_insert<stKeyPressData<stSampleMulti<short,4>>>
                      ((vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
                        *)res,iVar4,&local_128);
          }
          else {
            (iVar4._M_current)->cid = -1;
            (iVar4._M_current)->bind = -1;
            *(ulong *)&(iVar4._M_current)->predicted = CONCAT44(local_128._44_4_,0x3f);
            (iVar4._M_current)->pos = lVar14;
            (iVar4._M_current)->ccAvg = 0.0;
            ((iVar4._M_current)->waveform).samples = local_128.waveform.samples;
            ((iVar4._M_current)->waveform).n = iVar9;
            ppsVar1 = &(res->
                       super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                       ).
                       super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppsVar1 = *ppsVar1 + 1;
          }
        }
        (local_78->
        super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>).
        _M_impl.super__Vector_impl_data._M_start[lVar14].super_array<short,_4UL>._M_elems[0] =
             (short)(int)(local_130 * local_70);
        *(undefined8 *)
         (local_88->
         super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>).
         _M_impl.super__Vector_impl_data._M_start[lVar14].super_array<short,_4UL>._M_elems =
             *(undefined8 *)
              local_f0.
              super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start
              [*local_d8._M_impl.super__Deque_impl_data._M_start._M_cur].super_array<short,_4UL>.
              _M_elems;
      }
      local_138 = local_138 + 1;
    } while (local_138 < (long)__n);
  }
  if (removeLowPower) {
    do {
      psVar25 = (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar17 = (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      dVar31 = 0.0;
      for (psVar16 = psVar25; psVar17 != psVar16; psVar16 = psVar16 + 1) {
        dVar31 = dVar31 + (double)(int)local_f0.
                                       super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[psVar16->pos].
                                       super_array<short,_4UL>._M_elems[0];
      }
      psVar16 = (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (res->
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ).
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (res->
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ).
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (res->
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ).
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (psVar25 != psVar17) {
        lVar14 = ((long)psVar17 - (long)psVar25 >> 4) * -0x5555555555555555;
        auVar29._8_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar29._0_8_ = lVar14;
        auVar29._12_4_ = 0x45300000;
        local_130 = (dVar31 / ((auVar29._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0))) *
                    0.3;
        psVar21 = psVar25;
        do {
          if (local_130 <
              (double)(int)local_f0.
                           super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[psVar21->pos].
                           super_array<short,_4UL>._M_elems[0]) {
            iVar4._M_current =
                 (res->
                 super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                 ).
                 super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
              ::_M_realloc_insert<stKeyPressData<stSampleMulti<short,4>>const&>
                        ((vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
                          *)res,iVar4,psVar21);
            }
            else {
              psVar3 = (psVar21->waveform).samples;
              iVar9 = (psVar21->waveform).n;
              TVar7 = psVar21->pos;
              TVar8 = psVar21->ccAvg;
              TVar10 = psVar21->bind;
              TVar11 = psVar21->predicted;
              uVar12 = *(undefined4 *)&psVar21->field_0x2c;
              (iVar4._M_current)->cid = psVar21->cid;
              (iVar4._M_current)->bind = TVar10;
              (iVar4._M_current)->predicted = TVar11;
              *(undefined4 *)&(iVar4._M_current)->field_0x2c = uVar12;
              (iVar4._M_current)->pos = TVar7;
              (iVar4._M_current)->ccAvg = TVar8;
              ((iVar4._M_current)->waveform).samples = psVar3;
              ((iVar4._M_current)->waveform).n = iVar9;
              ppsVar1 = &(res->
                         super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ).
                         super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppsVar1 = *ppsVar1 + 1;
            }
          }
          psVar21 = psVar21 + 1;
        } while (psVar21 != psVar17);
      }
      psVar21 = (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar5 = (res->
               super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
               ).
               super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (psVar25 != (pointer)0x0) {
        operator_delete(psVar25,(long)psVar16 - (long)psVar25);
      }
    } while ((long)psVar21 - (long)psVar5 != (long)psVar17 - (long)psVar25);
  }
  psVar24 = (res->
            super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
            ).
            super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(res->
                         super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ).
                         super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar24 >> 4) *
                 -0x5555555555555555)) {
    local_128.pos._0_4_ = 0;
    local_128.pos._4_4_ = 0;
    local_128.ccAvg._0_4_ = 0;
    local_128.waveform.samples = (stSampleMulti<short,_4> *)0x0;
    local_128.waveform.n._0_4_ = 0;
    local_128.waveform.n._4_4_ = 0;
    std::
    vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
    ::_M_realloc_insert<stKeyPressData<stSampleMulti<short,4>>const&>
              ((vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
                *)&local_128,(iterator)0x0,psVar24);
    psVar25 = (res->
              super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ).
              super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar17 = (res->
              super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ).
              super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (1 < (int)((ulong)((long)psVar17 - (long)psVar25) >> 4) * -0x55555555) {
      lVar22 = (long)local_7c;
      lVar14 = 1;
      do {
        if (lVar22 < psVar25[lVar14].pos -
                     ((stKeyPressData<stSampleMulti<short,_4>_> *)(local_128.waveform.n + -0x30))->
                     pos) {
LAB_00122989:
          psVar24 = psVar25 + lVar14;
          if ((stKeyPressData<stSampleMulti<short,_4>_> *)local_128.waveform.n ==
              (stKeyPressData<stSampleMulti<short,_4>_> *)
              CONCAT44(local_128.pos._4_4_,(undefined4)local_128.pos)) {
            std::
            vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
            ::_M_realloc_insert<stKeyPressData<stSampleMulti<short,4>>const&>
                      ((vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
                        *)&local_128,(iterator)local_128.waveform.n,psVar24);
          }
          else {
            psVar3 = (psVar24->waveform).samples;
            iVar9 = (psVar24->waveform).n;
            TVar7 = psVar24->pos;
            TVar8 = psVar24->ccAvg;
            TVar10 = psVar24->bind;
            TVar11 = psVar24->predicted;
            uVar12 = *(undefined4 *)&psVar24->field_0x2c;
            ((stKeyPressData<stSampleMulti<short,_4>_> *)local_128.waveform.n)->cid = psVar24->cid;
            ((stKeyPressData<stSampleMulti<short,_4>_> *)local_128.waveform.n)->bind = TVar10;
            ((stKeyPressData<stSampleMulti<short,_4>_> *)local_128.waveform.n)->predicted = TVar11;
            *(undefined4 *)
             &((stKeyPressData<stSampleMulti<short,_4>_> *)local_128.waveform.n)->field_0x2c =
                 uVar12;
            ((stKeyPressData<stSampleMulti<short,_4>_> *)local_128.waveform.n)->pos = TVar7;
            ((stKeyPressData<stSampleMulti<short,_4>_> *)local_128.waveform.n)->ccAvg = TVar8;
            (((stKeyPressData<stSampleMulti<short,_4>_> *)local_128.waveform.n)->waveform).samples =
                 psVar3;
            (((stKeyPressData<stSampleMulti<short,_4>_> *)local_128.waveform.n)->waveform).n = iVar9
            ;
            local_128.waveform.n = local_128.waveform.n + 0x30;
          }
        }
        else {
          psVar6 = (local_88->
                   super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar20 = 0;
          do {
            sVar2 = *(short *)((long)psVar6[((stKeyPressData<stSampleMulti<short,_4>_> *)
                                            (local_128.waveform.n + -0x30))->pos].
                                     super_array<short,_4UL>._M_elems + lVar20);
            sVar18 = *(short *)((long)psVar6[psVar25[lVar14].pos].super_array<short,_4UL>._M_elems +
                               lVar20);
            if (sVar18 != sVar2) {
              if (sVar2 < sVar18) goto LAB_00122989;
              break;
            }
            lVar20 = lVar20 + 2;
          } while (lVar20 != 8);
        }
        lVar14 = lVar14 + 1;
        psVar25 = (res->
                  super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ).
                  super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar17 = (res->
                  super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ).
                  super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (lVar14 < (int)((ulong)((long)psVar17 - (long)psVar25) >> 4) * -0x55555555);
    }
    psVar16 = (res->
              super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ).
              super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (res->
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ).
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (res->
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ).
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (res->
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ).
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar23 = res->nClusters;
    std::
    vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ::_M_move_assign(&res->
                      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                     ,&local_128);
    psVar3 = local_128.waveform.samples;
    res->nClusters = local_128.ccAvg._0_4_;
    lVar14 = CONCAT44(local_128.pos._4_4_,(undefined4)local_128.pos);
    local_128.waveform.n._0_4_ = SUB84(psVar17,0);
    local_128.waveform.n._4_4_ = (undefined4)((ulong)psVar17 >> 0x20);
    local_128.pos._0_4_ = SUB84(psVar16,0);
    local_128.pos._4_4_ = (undefined4)((ulong)psVar16 >> 0x20);
    if (local_128.waveform.samples != (stSampleMulti<short,_4> *)0x0) {
      uVar19 = lVar14 - (long)local_128.waveform.samples;
      local_128.waveform.samples = (stSampleMulti<short,_4> *)psVar25;
      operator_delete(psVar3,uVar19);
      psVar25 = (pointer)local_128.waveform.samples;
    }
    local_128.waveform.samples = (stSampleMulti<short,_4> *)psVar25;
    local_128.ccAvg._0_4_ = iVar23;
    if ((pointer)local_128.waveform.samples != (pointer)0x0) {
      operator_delete(local_128.waveform.samples,
                      CONCAT44(local_128.pos._4_4_,(undefined4)local_128.pos) -
                      (long)local_128.waveform.samples);
    }
  }
  if (local_f0.
      super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.
                    super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_d8);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool findKeyPresses(
        const TWaveformViewT<TSampleMI16> & waveform,
        TKeyPressCollectionT<TSampleMI16> & res,
        TWaveformT<TSampleMI16> & waveformThreshold,
        TWaveformT<TSampleMI16> & waveformMax,
        double thresholdBackground,
        int historySize,
        int historySizeReset,
        bool removeLowPower) {
    res.clear();
    waveformThreshold.resize(waveform.n);
    waveformMax.resize(waveform.n);

    int rbBegin = 0;
    double rbAverage = 0.0;
    std::vector<double> rbSamples(8*historySize, 0.0);

    int k = historySize;
    std::deque<int64_t> que(k);

    auto samples = waveform.samples;
    auto n       = waveform.n;

    TWaveformT<TSampleMI16> waveformAbs(n);
    for (int64_t i = 0; i < n; ++i) {
        waveformAbs[i][0] = std::abs(samples[i][0]);
    }

    for (int64_t i = 0; i < n; ++i) {
        {
            int64_t ii = i - k/2;
            if (ii >= 0) {
                rbAverage *= rbSamples.size();
                rbAverage -= rbSamples[rbBegin];
                double acur = waveformAbs[i][0];
                rbSamples[rbBegin] = acur;
                rbAverage += acur;
                rbAverage /= rbSamples.size();
                if (++rbBegin >= (int) rbSamples.size()) {
                    rbBegin = 0;
                }
            }
        }

        if (i < k) {
            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }
            que.push_back(i);
        } else {
            while((!que.empty()) && que.front() <= i - k) {
                que.pop_front();
            }

            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }

            que.push_back(i);

            int64_t itest = i - k/2;
            if (itest >= 2*k && itest < n - 2*k && que.front() == itest) {
                double acur = waveformAbs[itest][0];
                if (acur > thresholdBackground*rbAverage) {
                    res.emplace_back(TKeyPressDataT<TSampleMI16> { std::move(waveform), itest, 0.0, -1, -1, '?' });
                }
            }
            waveformThreshold[itest][0] = thresholdBackground*rbAverage;
            waveformMax[itest] = waveformAbs[que.front()];
        }
    }

    if (removeLowPower) {
        while (true) {
            auto oldn = res.size();

            double avgPower = 0.0;
            for (const auto & kp : res) {
                avgPower += waveformAbs[kp.pos][0];
            }
            avgPower /= res.size();

            auto tmp = std::move(res);
            for (const auto & kp : tmp) {
                if (waveformAbs[kp.pos][0] > 0.3*avgPower) {
                    res.push_back(kp);
                }
            }

            if (res.size() == oldn) break;
        }
    }

    if (res.size() > 1) {
        TKeyPressCollectionT<TSampleMI16> res2;
        res2.push_back(res.front());

        for (int i = 1; i < (int) res.size(); ++i) {
            if (res[i].pos - res2.back().pos > historySizeReset || waveformMax[res[i].pos] > waveformMax[res2.back().pos]) {
                res2.push_back(res[i]);
            }
        }

        std::swap(res, res2);
    }

    return true;
}